

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  U32 UVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long *in_RDI;
  U32 mlv;
  U32 ofCode;
  U32 llv;
  int longOffsets;
  U32 u;
  U32 nbSeq;
  BYTE *mlCodeTable;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  seqDef *sequences;
  int local_34;
  uint local_30;
  
  lVar1 = in_RDI[4];
  lVar2 = in_RDI[6];
  lVar3 = in_RDI[5];
  uVar7 = in_RDI[1] - *in_RDI >> 3;
  local_34 = 0;
  if ((ulong)in_RDI[7] < (uVar7 & 0xffffffff)) {
    __assert_fail("nbSeq <= seqStorePtr->maxNbSeq",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5b0e,"int ZSTD_seqToCodes(const seqStore_t *)");
  }
  local_30 = 0;
  do {
    if ((uint)uVar7 <= local_30) {
      if ((int)in_RDI[9] == 1) {
        *(undefined1 *)(lVar1 + (ulong)*(uint *)((long)in_RDI + 0x4c)) = 0x23;
      }
      if ((int)in_RDI[9] == 2) {
        *(undefined1 *)(lVar3 + (ulong)*(uint *)((long)in_RDI + 0x4c)) = 0x34;
      }
      return local_34;
    }
    uVar4 = ZSTD_highbit32(0);
    UVar5 = ZSTD_LLcode(0);
    *(char *)(lVar1 + (ulong)local_30) = (char)UVar5;
    *(char *)(lVar2 + (ulong)local_30) = (char)uVar4;
    UVar5 = ZSTD_MLcode(0);
    *(char *)(lVar3 + (ulong)local_30) = (char)UVar5;
    uVar6 = MEM_64bits();
    if (uVar6 != 0) {
      uVar6 = MEM_32bits();
      uVar8 = 0x39;
      if (uVar6 != 0) {
        uVar8 = 0x19;
      }
      if (uVar8 <= uVar4) {
        __assert_fail("!(MEM_64bits() && ofCode >= STREAM_ACCUMULATOR_MIN)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5b16,"int ZSTD_seqToCodes(const seqStore_t *)");
      }
    }
    uVar6 = MEM_32bits();
    if (uVar6 != 0) {
      uVar6 = MEM_32bits();
      uVar8 = 0x39;
      if (uVar6 != 0) {
        uVar8 = 0x19;
      }
      if (uVar8 <= uVar4) {
        local_34 = 1;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

int ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    int longOffsets = 0;
    assert(nbSeq <= seqStorePtr->maxNbSeq);
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const ofCode = ZSTD_highbit32(sequences[u].offBase);
        U32 const mlv = sequences[u].mlBase;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ofCode;
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
        assert(!(MEM_64bits() && ofCode >= STREAM_ACCUMULATOR_MIN));
        if (MEM_32bits() && ofCode >= STREAM_ACCUMULATOR_MIN)
            longOffsets = 1;
    }
    if (seqStorePtr->longLengthType==ZSTD_llt_literalLength)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthType==ZSTD_llt_matchLength)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
    return longOffsets;
}